

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

bool __thiscall xmrig::Arguments::hasArg(Arguments *this,char *name)

{
  const_iterator cVar1;
  __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
  __first;
  const_iterator __val;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *in_RDI;
  difference_type in_stack_ffffffffffffffc0;
  __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
  *in_stack_ffffffffffffffc8;
  bool local_1;
  
  if (*(int *)&(in_RDI->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>)._M_impl.
               super__Vector_impl_data._M_finish == 1) {
    local_1 = false;
  }
  else {
    cVar1 = std::vector<xmrig::String,_std::allocator<xmrig::String>_>::begin(in_RDI);
    __first = __gnu_cxx::
              __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
              ::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    __val = std::vector<xmrig::String,_std::allocator<xmrig::String>_>::end(in_RDI);
    std::
    find<__gnu_cxx::__normal_iterator<xmrig::String_const*,std::vector<xmrig::String,std::allocator<xmrig::String>>>,char_const*>
              (__first,(__normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
                        )cVar1._M_current,&(__val._M_current)->m_data);
    cVar1 = std::vector<xmrig::String,_std::allocator<xmrig::String>_>::end(in_RDI);
    local_1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
                          *)cVar1._M_current,
                         (__normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
                          *)in_RDI);
  }
  return local_1;
}

Assistant:

bool xmrig::Arguments::hasArg(const char *name) const
{
    if (m_argc == 1) {
        return false;
    }

    return std::find(m_data.begin() + 1, m_data.end(), name) != m_data.end();
}